

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O0

void __thiscall
tchecker::typed_clock_to_clock_assign_statement_t::typed_clock_to_clock_assign_statement_t
          (typed_clock_to_clock_assign_statement_t *this,statement_type_t type,
          shared_ptr<const_tchecker::typed_lvalue_expression_t> *lvalue,
          shared_ptr<const_tchecker::typed_lvalue_expression_t> *rvalue)

{
  shared_ptr<const_tchecker::typed_lvalue_expression_t> *lvalue_00;
  statement_type_t type_00;
  bool bVar1;
  int iVar2;
  expression_type_t eVar3;
  element_type *peVar4;
  invalid_argument *piVar5;
  shared_ptr<const_tchecker::typed_expression_t> local_38;
  __shared_ptr_access<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_28;
  shared_ptr<const_tchecker::typed_lvalue_expression_t> *rvalue_local;
  shared_ptr<const_tchecker::typed_lvalue_expression_t> *lvalue_local;
  typed_clock_to_clock_assign_statement_t *ptStack_10;
  statement_type_t type_local;
  typed_clock_to_clock_assign_statement_t *this_local;
  
  local_28 = (__shared_ptr_access<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)rvalue;
  rvalue_local = lvalue;
  lvalue_local._4_4_ = type;
  ptStack_10 = this;
  statement_t::statement_t((statement_t *)this);
  type_00 = lvalue_local._4_4_;
  lvalue_00 = rvalue_local;
  std::shared_ptr<tchecker::typed_expression_t_const>::
  shared_ptr<tchecker::typed_lvalue_expression_t_const,void>
            ((shared_ptr<tchecker::typed_expression_t_const> *)&local_38,
             (shared_ptr<const_tchecker::typed_lvalue_expression_t> *)local_28);
  typed_assign_statement_t::typed_assign_statement_t
            (&this->super_typed_assign_statement_t,&PTR_construction_vtable_56__00427610,type_00,
             lvalue_00,&local_38);
  std::shared_ptr<const_tchecker::typed_expression_t>::~shared_ptr(&local_38);
  *(undefined8 *)&(this->super_typed_assign_statement_t).super_typed_statement_t = 0x427568;
  *(undefined8 *)&(this->super_typed_assign_statement_t).super_typed_statement_t = 0x427568;
  *(undefined8 *)&(this->super_typed_assign_statement_t).super_assign_statement_t = 0x4275d8;
  peVar4 = std::
           __shared_ptr_access<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)rvalue_local);
  iVar2 = (**(code **)(*(long *)&peVar4->super_typed_expression_t + 0x38))();
  if (iVar2 != 1) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"lvalue of size > 1 is not assignable");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar4 = std::
           __shared_ptr_access<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)rvalue_local);
  eVar3 = typed_expression_t::type(&peVar4->super_typed_expression_t);
  bVar1 = clock_assignable(eVar3);
  if (!bVar1) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"lvalue is not an assignable clock");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar4 = std::
           __shared_ptr_access<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_28);
  eVar3 = typed_expression_t::type(&peVar4->super_typed_expression_t);
  bVar1 = clock_valued(eVar3);
  if (!bVar1) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"rvalue is not clock valued");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

typed_clock_to_clock_assign_statement_t::typed_clock_to_clock_assign_statement_t(
    enum tchecker::statement_type_t type, std::shared_ptr<tchecker::typed_lvalue_expression_t const> const & lvalue,
    std::shared_ptr<tchecker::typed_lvalue_expression_t const> const & rvalue)
    : tchecker::typed_assign_statement_t(type, lvalue, rvalue)
{
  if (lvalue->size() != 1)
    throw std::invalid_argument("lvalue of size > 1 is not assignable");
  if (!tchecker::clock_assignable(lvalue->type()))
    throw std::invalid_argument("lvalue is not an assignable clock");
  if (!tchecker::clock_valued(rvalue->type()))
    throw std::invalid_argument("rvalue is not clock valued");
}